

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.h
# Opt level: O0

void __thiscall
btQuantizedBvh::mergeInternalNodeAabb
          (btQuantizedBvh *this,int nodeIndex,btVector3 *newAabbMin,btVector3 *newAabbMax)

{
  unsigned_short uVar1;
  btQuantizedBvhNode *pbVar2;
  int in_ESI;
  btVector3 *in_RDI;
  btVector3 *unaff_retaddr;
  unsigned_short *in_stack_00000008;
  btQuantizedBvh *in_stack_00000010;
  int i;
  unsigned_short quantizedAabbMax [3];
  unsigned_short quantizedAabbMin [3];
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffd4;
  ushort local_26 [13];
  int local_c;
  btVector3 *pbVar4;
  
  local_c = in_ESI;
  if (((uint)in_RDI[4].m_floats[0] & 1) == 0) {
    btAlignedObjectArray<btOptimizedBvhNode>::operator[]
              ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI[6].m_floats + 2),in_ESI);
    btVector3::setMin((btVector3 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_RDI);
    btAlignedObjectArray<btOptimizedBvhNode>::operator[]
              ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI[6].m_floats + 2),local_c);
    btVector3::setMax((btVector3 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_RDI);
  }
  else {
    pbVar4 = in_RDI;
    quantize(in_stack_00000010,in_stack_00000008,unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
    quantize(in_stack_00000010,in_stack_00000008,unaff_retaddr,(int)((ulong)pbVar4 >> 0x20));
    for (iVar3 = 0; iVar3 < 3; iVar3 = iVar3 + 1) {
      pbVar2 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI[10].m_floats + 2),
                          local_c);
      if (local_26[iVar3] < pbVar2->m_quantizedAabbMin[iVar3]) {
        uVar1 = local_26[iVar3];
        pbVar2 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI[10].m_floats + 2),
                            local_c);
        pbVar2->m_quantizedAabbMin[iVar3] = uVar1;
      }
      pbVar2 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI[10].m_floats + 2),
                          local_c);
      if (pbVar2->m_quantizedAabbMax[iVar3] <
          *(ushort *)(&stack0xffffffffffffffd4 + (long)iVar3 * 2)) {
        uVar1 = *(unsigned_short *)(&stack0xffffffffffffffd4 + (long)iVar3 * 2);
        pbVar2 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI[10].m_floats + 2),
                            local_c);
        pbVar2->m_quantizedAabbMax[iVar3] = uVar1;
      }
    }
  }
  return;
}

Assistant:

void mergeInternalNodeAabb(int nodeIndex,const btVector3& newAabbMin,const btVector3& newAabbMax) 
	{
		if (m_useQuantization)
		{
			unsigned short int quantizedAabbMin[3];
			unsigned short int quantizedAabbMax[3];
			quantize(quantizedAabbMin,newAabbMin,0);
			quantize(quantizedAabbMax,newAabbMax,1);
			for (int i=0;i<3;i++)
			{
				if (m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[i] > quantizedAabbMin[i])
					m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[i] = quantizedAabbMin[i];

				if (m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[i] < quantizedAabbMax[i])
					m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[i] = quantizedAabbMax[i];

			}
		} else
		{
			//non-quantized
			m_contiguousNodes[nodeIndex].m_aabbMinOrg.setMin(newAabbMin);
			m_contiguousNodes[nodeIndex].m_aabbMaxOrg.setMax(newAabbMax);		
		}
	}